

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<11,_7,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  Matrix<float,_4,_2> *mat;
  Matrix<float,_4,_2> *mat_00;
  long lVar5;
  undefined4 uVar6;
  Vector<float,_3> res_2;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Type in0;
  float afStack_c8 [6];
  Vec4 *local_b0;
  float local_a8 [4];
  float local_98 [4];
  float local_88 [4];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Matrix<float,_4,_2> local_50;
  Vec4 *local_30;
  float local_28;
  Vec4 *local_1c;
  
  puVar1 = &local_78;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        uVar6 = 0x3f800000;
        if (lVar2 != lVar5) {
          uVar6 = 0;
        }
        *(undefined4 *)((long)puVar1 + lVar5) = uVar6;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 == 0x10);
      lVar4 = lVar4 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      lVar2 = lVar2 + 0x10;
    } while (lVar4 != 4);
    local_78 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_70 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_68 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_60 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    mat = (Matrix<float,_4,_2> *)&DAT_00000004;
  }
  else {
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    puVar3 = &s_constInMat2x4;
    mat = (Matrix<float,_4,_2> *)0x0;
    do {
      lVar2 = 0;
      do {
        *(undefined4 *)((long)puVar1 + lVar2 * 4) = *(undefined4 *)((long)puVar3 + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 == 4);
      mat = (Matrix<float,_4,_2> *)((long)(mat->m_data).m_data[0].m_data + 1);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar3 = puVar3 + 2;
    } while (mat != (Matrix<float,_4,_2> *)&DAT_00000004);
  }
  increment<float,4,2>((Matrix<float,_4,_2> *)&local_30,(MatrixCaseUtils *)&local_78,mat);
  local_50.m_data.m_data[0].m_data._0_8_ = local_30;
  local_50.m_data.m_data[0].m_data[2] = local_28;
  local_b0 = local_1c;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  lVar2 = 0;
  do {
    local_88[lVar2] =
         local_50.m_data.m_data[0].m_data[lVar2] + *(float *)((long)&local_b0 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  increment<float,4,2>(&local_50,(MatrixCaseUtils *)&local_78,mat_00);
  local_b0 = (Vec4 *)local_50.m_data.m_data[0].m_data._0_8_;
  local_a8[0] = local_50.m_data.m_data[0].m_data[2];
  afStack_c8[2] = local_50.m_data.m_data[1].m_data[1];
  afStack_c8[3] = local_50.m_data.m_data[1].m_data[2];
  afStack_c8[4] = local_50.m_data.m_data[1].m_data[3];
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  lVar2 = 0;
  do {
    local_98[lVar2] = *(float *)((long)&local_b0 + lVar2 * 4) + afStack_c8[lVar2 + 2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  afStack_c8[2] = 0.0;
  afStack_c8[3] = 0.0;
  afStack_c8[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_c8[lVar2 + 2] = local_88[lVar2] + local_98[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_b0 = &evalCtx->color;
  local_a8[0] = 0.0;
  local_a8[1] = 1.4013e-45;
  local_a8[2] = 2.8026e-45;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_b0 + lVar2 * 4)] = afStack_c8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(increment(in0)) + reduceToVec3(increment(in0));
	}